

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluk.c
# Opt level: O3

int ffuintfi4(uint *input,long ntodo,double scale,double zero,int *output,int *status)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 2147483648.0)) || (NAN(zero))) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      if (0 < ntodo) {
        lVar1 = 0;
        do {
          dVar4 = ((double)input[lVar1] - zero) / scale;
          if (-2147483648.49 <= dVar4) {
            if (dVar4 <= 2147483647.49) {
              if (0.0 <= dVar4) {
                dVar4 = dVar4 + 0.5;
              }
              else {
                dVar4 = dVar4 + -0.5;
              }
              iVar3 = (int)dVar4;
            }
            else {
              *status = -0xb;
              iVar3 = 0x7fffffff;
            }
          }
          else {
            *status = -0xb;
            iVar3 = -0x80000000;
          }
          output[lVar1] = iVar3;
          lVar1 = lVar1 + 1;
        } while (ntodo != lVar1);
      }
    }
    else if (0 < ntodo) {
      lVar1 = 0;
      do {
        uVar2 = input[lVar1];
        if ((int)uVar2 < 0) {
          *status = -0xb;
          uVar2 = 0x7fffffff;
        }
        output[lVar1] = uVar2;
        lVar1 = lVar1 + 1;
      } while (ntodo != lVar1);
    }
  }
  else if (0 < ntodo) {
    lVar1 = 0;
    do {
      output[lVar1] = input[lVar1] ^ 0x80000000;
      lVar1 = lVar1 + 1;
    } while (ntodo != lVar1);
  }
  return *status;
}

Assistant:

int ffuintfi4(unsigned int *input,  /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            INT32BIT *output,  /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 2147483648.)
    {       
        /* Instead of subtracting 2147483648, it is more efficient */
        /* to just flip the sign bit with the XOR operator */

        for (ii = 0; ii < ntodo; ii++)
             output[ii] =  ( *(int *) &input[ii] ) ^ 0x80000000;
    }
    else if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] > INT32_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
                output[ii] = input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (INT32BIT) (dvalue + .5);
                else
                    output[ii] = (INT32BIT) (dvalue - .5);
            }
        }
    }
    return(*status);
}